

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O2

bool __thiscall
ASDCP::MXF::SimpleArray<ASDCP::MXF::RIP::PartitionPair>::Archive
          (SimpleArray<ASDCP::MXF::RIP::PartitionPair> *this,MemIOWriter *Writer)

{
  byte bVar1;
  _List_node_base *p_Var2;
  
  bVar1 = 1;
  p_Var2 = (_List_node_base *)
           &this->
            super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
  ;
  while (((bVar1 & 1) != 0 &&
         (p_Var2 = (((_List_base<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
                      *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
         p_Var2 != (_List_node_base *)
                   &this->
                    super_list<ASDCP::MXF::RIP::PartitionPair,_std::allocator<ASDCP::MXF::RIP::PartitionPair>_>
         ))) {
    bVar1 = (**(code **)((long)p_Var2[1]._M_next + 0x20))(p_Var2 + 1,Writer);
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool Archive(Kumu::MemIOWriter* Writer) const {
	    bool result = true;
	    typename std::list<T>::const_iterator l_i = this->begin();

	    for ( ; l_i != this->end() && result; l_i++ )
	      result = (*l_i).Archive(Writer);

	    return result;
	  }